

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O0

void __thiscall QToolButton::actionEvent(QToolButton *this,QActionEvent *event)

{
  long lVar1;
  bool bVar2;
  Type TVar3;
  QToolButtonPrivate *this_00;
  QAction *sender;
  QActionEvent *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  Function in_stack_00000010;
  offset_in_QAction_to_subr in_stack_00000020;
  QToolButtonPrivate *d;
  QAction *action;
  QObject *in_stack_ffffffffffffff88;
  QObject *in_stack_ffffffffffffff90;
  Connection in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QToolButton *)0x709baf);
  sender = QActionEvent::action(in_RSI);
  TVar3 = QEvent::type((QEvent *)in_RSI);
  if (TVar3 == ActionChanged) {
    if (sender == this_00->defaultAction) {
      setDefaultAction((QToolButton *)this_00,(QAction *)this);
    }
  }
  else if (TVar3 == ActionAdded) {
    QObjectPrivate::connect<void(QAction::*)(bool),void(QToolButtonPrivate::*)()>
              (sender,in_stack_00000020,(Object *)in_stack_ffffffffffffffe8.d_ptr,in_stack_00000010,
               AutoConnection);
    QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffe8);
  }
  else if (TVar3 == ActionRemoved) {
    if (this_00->defaultAction == sender) {
      this_00->defaultAction = (QAction *)0x0;
    }
    bVar2 = ::operator==((QAction **)in_stack_ffffffffffffff90,
                         (QPointer<QAction> *)in_stack_ffffffffffffff88);
    if (bVar2) {
      QPointer<QAction>::operator=
                ((QPointer<QAction> *)in_stack_ffffffffffffff90,(QAction *)in_stack_ffffffffffffff88
                );
    }
    QObject::disconnect(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(char *)0x709cf1);
  }
  QWidget::actionEvent(in_RDI,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolButton::actionEvent(QActionEvent *event)
{
    Q_D(QToolButton);
    auto action = static_cast<QAction *>(event->action());
    switch (event->type()) {
    case QEvent::ActionChanged:
        if (action == d->defaultAction)
            setDefaultAction(action); // update button state
        break;
    case QEvent::ActionAdded:
        QObjectPrivate::connect(action, &QAction::triggered, d,
                                &QToolButtonPrivate::onActionTriggered);
        break;
    case QEvent::ActionRemoved:
        if (d->defaultAction == action)
            d->defaultAction = nullptr;
#if QT_CONFIG(menu)
        if (action == d->menuAction)
            d->menuAction = nullptr;
#endif
        action->disconnect(this);
        break;
    default:
        ;
    }
    QAbstractButton::actionEvent(event);
}